

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval.h
# Opt level: O1

void __thiscall
embree::sse2::PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::PatchEval
          (PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,CacheEntry *entry,
          size_t commitCounter,HalfEdge *edge,char *vertices,size_t stride,float u,float v,
          vfloat_impl<4> *P,vfloat_impl<4> *dPdu,vfloat_impl<4> *dPdv,vfloat_impl<4> *ddPdudu,
          vfloat_impl<4> *ddPdvdv,vfloat_impl<4> *ddPdudv)

{
  sse2 *this_00;
  long lVar1;
  size_t stride_00;
  char *vertices_00;
  long *plVar2;
  Ref This;
  long lVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  anon_class_1_0_00000001 alloc;
  float v_local;
  float u_local;
  size_t local_90;
  char *local_88;
  HalfEdge *local_80;
  long *local_78;
  PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *local_70;
  long local_68;
  FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> local_60;
  
  this->P = P;
  this->dPdu = dPdu;
  this->dPdv = dPdv;
  this->ddPdudu = ddPdudu;
  this->ddPdvdv = ddPdvdv;
  this->ddPdudv = ddPdudv;
  local_68 = DAT_022364c0;
  v_local = v;
  u_local = u;
  local_90 = stride;
  local_88 = vertices;
  local_80 = edge;
  local_70 = this;
  plVar2 = (long *)__tls_get_addr(&PTR_02224140);
  if (*plVar2 == 0) {
    SharedLazyTessellationCache::getNextRenderThreadWorkState
              ((SharedLazyTessellationCache *)
               &SharedLazyTessellationCache::sharedLazyTessellationCache);
  }
  lVar3 = commitCounter * 8;
  this_00 = (sse2 *)*plVar2;
  do {
    LOCK();
    uVar5 = *(ulong *)this_00;
    *(long *)this_00 = *(long *)this_00 + 1;
    UNLOCK();
    if (3 < uVar5) {
      local_78 = plVar2;
      sse2::PatchEval(this_00);
      plVar2 = local_78;
    }
    vertices_00 = local_88;
    uVar5 = (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i;
    if ((uVar5 == 0) ||
       (This.ptr = (uVar5 & 0xffffffffff) + SharedLazyTessellationCache::sharedLazyTessellationCache
       , ((long)uVar5 >> 0x28) + 7U < (ulong)(DAT_022364c0 + lVar3))) {
      This.ptr = 0;
    }
    if (This.ptr != 0) goto LAB_00e19e57;
    if (((entry->mutex).flag.super_atomic<bool>._M_base._M_i & 1U) == 0) {
      LOCK();
      bVar6 = (entry->mutex).flag.super_atomic<bool>._M_base._M_i == false;
      if (bVar6) {
        (entry->mutex).flag.super_atomic<bool>._M_base._M_i = true;
      }
      UNLOCK();
      if (bVar6) {
        lVar1 = (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i;
        if ((lVar1 == 0) || ((lVar1 >> 0x28) + 7U < (ulong)(DAT_022364c0 + lVar3))) {
          iVar4 = (int)DAT_022364c0;
          This = PatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::operator()
                           (&alloc,local_80,local_88,local_90);
          uVar5 = (ulong)(uint)(iVar4 + (int)lVar3) << 0x28 |
                  This.ptr - SharedLazyTessellationCache::sharedLazyTessellationCache;
          if (This.ptr == 0) {
            uVar5 = 0;
          }
          LOCK();
          (entry->tag).data.super_atomic<long>.super___atomic_base<long>._M_i = uVar5;
          UNLOCK();
          (entry->mutex).flag.super_atomic<bool>._M_base._M_i = false;
LAB_00e19e57:
          stride_00 = local_90;
          if (((This.ptr == 0) || (local_68 + lVar3 + 7U < (ulong)(DAT_022364c0 + lVar3))) ||
             (bVar6 = eval(local_70,(Ref)This.ptr,&u_local,&v_local,1.0,0), !bVar6)) {
            if (*plVar2 == 0) {
              SharedLazyTessellationCache::getNextRenderThreadWorkState
                        ((SharedLazyTessellationCache *)
                         &SharedLazyTessellationCache::sharedLazyTessellationCache);
            }
            LOCK();
            *(long *)*plVar2 = *(long *)*plVar2 + -1;
            UNLOCK();
            FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::
            FeatureAdaptiveEval(&local_60,local_80,vertices_00,stride_00,u_local,v_local,P,dPdu,dPdv
                                ,ddPdudu,ddPdvdv,ddPdudv);
          }
          else {
            if (*plVar2 == 0) {
              SharedLazyTessellationCache::getNextRenderThreadWorkState
                        ((SharedLazyTessellationCache *)
                         &SharedLazyTessellationCache::sharedLazyTessellationCache);
            }
            LOCK();
            *(long *)*plVar2 = *(long *)*plVar2 + -1;
            UNLOCK();
          }
          return;
        }
        (entry->mutex).flag.super_atomic<bool>._M_base._M_i = false;
      }
    }
    LOCK();
    *(long *)this_00 = *(long *)this_00 + -1;
    UNLOCK();
  } while( true );
}

Assistant:

PatchEval (SharedLazyTessellationCache::CacheEntry& entry, size_t commitCounter, 
                   const HalfEdge* edge, const char* vertices, size_t stride, const float u, const float v, 
                   Vertex* P, Vertex* dPdu, Vertex* dPdv, Vertex* ddPdudu, Vertex* ddPdvdv, Vertex* ddPdudv)
        : P(P), dPdu(dPdu), dPdv(dPdv), ddPdudu(ddPdudu), ddPdvdv(ddPdvdv), ddPdudv(ddPdudv)
        {
          /* conservative time for the very first allocation */
          auto time = SharedLazyTessellationCache::sharedLazyTessellationCache.getTime(commitCounter);

          Ref patch = SharedLazyTessellationCache::lookup(entry,commitCounter,[&] () {
              auto alloc = [&](size_t bytes) { return SharedLazyTessellationCache::malloc(bytes); };
              return Patch::create(alloc,edge,vertices,stride);
            },true);

          auto curTime = SharedLazyTessellationCache::sharedLazyTessellationCache.getTime(commitCounter);
          const bool allAllocationsValid = SharedLazyTessellationCache::validTime(time,curTime);

          if (patch && allAllocationsValid &&  eval(patch,u,v,1.0f,0)) {
            SharedLazyTessellationCache::unlock();
            return;
          }
          SharedLazyTessellationCache::unlock();
          FeatureAdaptiveEval<Vertex,Vertex_t>(edge,vertices,stride,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv);
          PATCH_DEBUG_SUBDIVISION(edge,c,-1,-1);
        }